

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  byte bVar3;
  string test_name;
  allocator<char> local_31;
  long *local_30 [2];
  long local_20 [2];
  
  if (argc < 2) {
    return 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,argv[1],&local_31);
  iVar2 = std::__cxx11::string::compare((char *)local_30);
  if (iVar2 == 0) {
    bVar1 = run_json_example();
    if (bVar1) {
      bVar1 = run_msgpack_example();
    }
    else {
      bVar1 = false;
    }
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)local_30);
    if (iVar2 != 0) {
      bVar1 = true;
      bVar3 = 0;
      goto LAB_0011b7d9;
    }
    bVar1 = run_simple_msgpack_test();
  }
  bVar3 = bVar1 ^ 1;
  bVar1 = false;
LAB_0011b7d9:
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  if (bVar1) {
    return 1;
  }
  return (uint)bVar3;
}

Assistant:

int main(int argc, char** argv)
{

  if (argc > 1)
  {
    std::string test_name = argv[1];
    if (test_name == "example")
      return (run_json_example() && run_msgpack_example() ? EXIT_SUCCESS : EXIT_FAILURE);
    else if (test_name == "simple")
      return (run_simple_msgpack_test() ? EXIT_SUCCESS : EXIT_FAILURE);
  }

  return EXIT_FAILURE;
}